

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

void nn_ep_clear_error(nn_ep *self)

{
  long in_RDI;
  int in_stack_0000000c;
  nn_sock *in_stack_00000010;
  int in_stack_00000024;
  nn_ep *in_stack_00000028;
  nn_sock *in_stack_00000030;
  
  if (*(int *)(in_RDI + 0x110) != 0) {
    nn_sock_stat_increment(in_stack_00000010,in_stack_0000000c,(int64_t)self);
    *(undefined4 *)(in_RDI + 0x110) = 0;
    nn_sock_report_error(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  }
  return;
}

Assistant:

void nn_ep_clear_error (struct nn_ep *self)
{
    if (self->last_errno == 0)
        /*  Error is already clear, no need to report it  */
        return;
    nn_sock_stat_increment (self->sock, NN_STAT_CURRENT_EP_ERRORS, -1);
    self->last_errno = 0;
    nn_sock_report_error (self->sock, self, 0);
}